

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O0

void __thiscall TriangleMesh::TriangleMesh(TriangleMesh *this,string *filename)

{
  string *in_RSI;
  string *in_RDI;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_stack_00000018;
  BasicContainer *in_stack_00000020;
  char *in_stack_000006b0;
  TriangleMesh *in_stack_000006b8;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_stack_ffffffffffffff90;
  string local_68 [32];
  string local_48 [72];
  
  *(undefined ***)in_RDI = &PTR_intersect_001e8090;
  std::__cxx11::string::string(local_68,in_RSI);
  getpath(in_RDI);
  std::__cxx11::string::c_str();
  loadfromfile(in_stack_000006b8,in_stack_000006b0);
  BasicContainer::BasicContainer(in_stack_00000020,in_stack_00000018);
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector
            (in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  *(undefined ***)in_RDI = &PTR_intersect_001e8090;
  return;
}

Assistant:

TriangleMesh(std::string filename):
		BasicContainer(loadfromfile(getpath(filename).c_str())) {}